

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall mocker::Lexer::keywordsOrIdentifier(Lexer *this,string *curTok)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  reference pcVar4;
  LexError *this_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  *local_328;
  TokenID local_30c;
  size_t local_308;
  size_t sStack_300;
  size_t local_2f8;
  size_t sStack_2f0;
  char local_2d9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_2d8;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
  local_2b8;
  const_iterator iter;
  TokenID local_2a8 [17];
  TokenID local_264;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  *local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_50;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  string *curTok_local;
  Lexer *this_local;
  
  local_18 = (undefined1  [8])curTok;
  curTok_local = (string *)this;
  if (keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_);
    if (iVar2 != 0) {
      local_260 = &local_258;
      local_264 = Bool;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>(local_260,(char (*) [5])"bool",&local_264);
      local_260 = &local_230;
      local_2a8[0xc] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[4],_mocker::TokenID,_true>
                (local_260,(char (*) [4])0x2c5557,local_2a8 + 0xc);
      local_260 = &local_208;
      local_2a8[0xb] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[7],_mocker::TokenID,_true>
                (local_260,(char (*) [7])0x2c57ed,local_2a8 + 0xb);
      local_260 = &local_1e0;
      local_2a8[10] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>
                (local_260,(char (*) [5])"void",local_2a8 + 10);
      local_260 = &local_1b8;
      local_2a8[9] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>
                (local_260,(char (*) [5])0x2c5418,local_2a8 + 9);
      local_260 = &local_190;
      local_2a8[8] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[3],_mocker::TokenID,_true>(local_260,(char (*) [3])"if",local_2a8 + 8);
      local_260 = &local_168;
      local_2a8[7] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>(local_260,(char (*) [5])"else",local_2a8 + 7)
      ;
      local_260 = &local_140;
      local_2a8[6] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[4],_mocker::TokenID,_true>(local_260,(char (*) [4])"for",local_2a8 + 6);
      local_260 = &local_118;
      local_2a8[5] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[6],_mocker::TokenID,_true>
                (local_260,(char (*) [6])"while",local_2a8 + 5);
      local_260 = &local_f0;
      local_2a8[4] = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[6],_mocker::TokenID,_true>
                (local_260,(char (*) [6])"break",local_2a8 + 4);
      local_260 = &local_c8;
      local_2a8[3] = 0xc;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[9],_mocker::TokenID,_true>
                (local_260,(char (*) [9])"continue",local_2a8 + 3);
      local_260 = &local_a0;
      local_2a8[2] = 0xd;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[7],_mocker::TokenID,_true>
                (local_260,(char (*) [7])"return",local_2a8 + 2);
      local_260 = &local_78;
      local_2a8[1] = 0xe;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[4],_mocker::TokenID,_true>(local_260,(char (*) [4])"new",local_2a8 + 1);
      local_260 = &local_50;
      local_2a8[0] = Class;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[6],_mocker::TokenID,_true>(local_260,(char (*) [6])"class",local_2a8);
      local_28 = &local_258;
      local_20 = 0xe;
      this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>
                 *)((long)&iter.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
                           ._M_cur + 5);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>
      ::allocator(this_00);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>_>
      ::unordered_map(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_,__l,0,
                      (hasher *)
                      ((long)&iter.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
                              ._M_cur + 7),
                      (key_equal *)
                      ((long)&iter.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
                              ._M_cur + 6),this_00);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>
                    *)((long)&iter.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
                              ._M_cur + 5));
      local_328 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
                   *)&local_28;
      do {
        local_328 = local_328 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
        ::~pair(local_328);
      } while (local_328 != &local_258);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>_>
                   ::~unordered_map,
                   &keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_);
    }
  }
  local_2b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>_>
       ::find(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_,(key_type *)local_18
             );
  __range1 = (string *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>_>
             ::end(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_);
  bVar1 = std::__detail::operator!=
                    (&local_2b8,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
                      *)&__range1);
  if (bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_false,_true>
                           *)&local_2b8);
    std::vector<mocker::Token,std::allocator<mocker::Token>>::
    emplace_back<mocker::TokenID_const&,mocker::Position&,mocker::Position&>
              ((vector<mocker::Token,std::allocator<mocker::Token>> *)&this->tokens,&pvVar3->second,
               &this->curPos,&this->nxtPos);
  }
  else {
    __end1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_2d8._M_current = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffd28);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      local_2d9 = *pcVar4;
      iVar2 = isalnum((int)local_2d9);
      if ((iVar2 == 0) && (local_2d9 != '_')) {
        this_01 = (LexError *)__cxa_allocate_exception(0x48);
        local_2f8 = (this->curPos).line;
        sStack_2f0 = (this->curPos).col;
        local_308 = (this->nxtPos).line;
        sStack_300 = (this->nxtPos).col;
        LexError::LexError(this_01,this->curPos,this->nxtPos);
        __cxa_throw(this_01,&LexError::typeinfo,LexError::~LexError);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    local_30c = Identifier;
    std::vector<mocker::Token,std::allocator<mocker::Token>>::
    emplace_back<mocker::TokenID,mocker::Position&,mocker::Position&,std::__cxx11::string_const&>
              ((vector<mocker::Token,std::allocator<mocker::Token>> *)&this->tokens,&local_30c,
               &this->curPos,&this->nxtPos,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18);
  }
  return;
}

Assistant:

void Lexer::keywordsOrIdentifier(const std::string &curTok) {
  static const std::unordered_map<std::string, TokenID> kw = {
      {"bool", TokenID::Bool},         {"int", TokenID::Int},
      {"string", TokenID::String},     {"void", TokenID::Void},
      {"null", TokenID::Null},         {"if", TokenID::If},
      {"else", TokenID::Else},         {"for", TokenID::For},
      {"while", TokenID::While},       {"break", TokenID::Break},
      {"continue", TokenID::Continue}, {"return", TokenID::Return},
      {"new", TokenID::New},           {"class", TokenID::Class},
      //      {"this", TokenID::This}
  };
  auto iter = kw.find(curTok);
  if (iter != kw.end()) {
    tokens.emplace_back(iter->second, curPos, nxtPos);
    return;
  }
  for (auto ch : curTok)
    if (!std::isalnum(ch) && ch != '_')
      throw LexError(curPos, nxtPos);
  tokens.emplace_back(TokenID::Identifier, curPos, nxtPos, curTok);
}